

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utf.h
# Opt level: O3

code_point booster::locale::utf::utf_traits<char,1>::decode_valid<char_const*>(char **p)

{
  byte bVar1;
  byte *pbVar2;
  byte *pbVar3;
  byte *pbVar4;
  uint uVar5;
  int iVar6;
  
  pbVar2 = (byte *)*p;
  pbVar4 = pbVar2 + 1;
  *p = (char *)pbVar4;
  bVar1 = *pbVar2;
  uVar5 = (uint)bVar1;
  if (0xbf < bVar1) {
    iVar6 = 1;
    if (0xdf < bVar1) {
      iVar6 = 3 - (uint)(bVar1 < 0xf0);
    }
    uVar5 = ~(-1 << (6U - (char)iVar6 & 0x1f)) & (uint)bVar1;
    if (iVar6 != 1) {
      pbVar3 = pbVar4;
      if (iVar6 != 2) {
        pbVar3 = pbVar2 + 2;
        *p = (char *)pbVar3;
        uVar5 = uVar5 << 6 | pbVar2[1] & 0x3f;
      }
      pbVar4 = pbVar3 + 1;
      *p = (char *)pbVar4;
      uVar5 = uVar5 << 6 | *pbVar3 & 0x3f;
    }
    *p = (char *)(pbVar4 + 1);
    uVar5 = *pbVar4 & 0x3f | uVar5 << 6;
  }
  return uVar5;
}

Assistant:

static code_point decode_valid(Iterator &p)
        {
            unsigned char lead = *p++;
            if(lead < 192)
                return lead;

            int trail_size;

            if(lead < 224)
                trail_size = 1;
            else if(BOOSTER_LOCALE_LIKELY(lead < 240)) // non-BMP rare
                trail_size = 2;
            else
                trail_size = 3;
            
            code_point c = lead & ((1<<(6-trail_size))-1);

            switch(trail_size) {
            case 3:
                c = (c << 6) | ( static_cast<unsigned char>(*p++) & 0x3F);
            case 2:
                c = (c << 6) | ( static_cast<unsigned char>(*p++) & 0x3F);
            case 1:
                c = (c << 6) | ( static_cast<unsigned char>(*p++) & 0x3F);
            }

            return c;
        }